

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void codeReal(Vdbe *v,char *z,int negateFlag,int iMem)

{
  long lVar1;
  undefined4 in_ECX;
  int in_EDX;
  long in_RSI;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  int unaff_retaddr;
  double value;
  u8 in_stack_00000043;
  int in_stack_00000044;
  double *in_stack_00000048;
  char *in_stack_00000050;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  Vdbe *p;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI != 0) {
    p = (Vdbe *)0xffffffffffffffff;
    sqlite3Strlen30((char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    sqlite3AtoF(in_stack_00000050,in_stack_00000048,in_stack_00000044,in_stack_00000043);
    if (in_EDX != 0) {
      p = (Vdbe *)((ulong)p ^ 0x8000000000000000);
    }
    sqlite3VdbeAddOp4Dup8
              (p,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,(int)((ulong)in_RSI >> 0x20),(int)in_RSI,
               (u8 *)CONCAT44(in_EDX,in_ECX),unaff_retaddr);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void codeReal(Vdbe *v, const char *z, int negateFlag, int iMem){
  if( ALWAYS(z!=0) ){
    double value;
    sqlite3AtoF(z, &value, sqlite3Strlen30(z), SQLITE_UTF8);
    assert( !sqlite3IsNaN(value) ); /* The new AtoF never returns NaN */
    if( negateFlag ) value = -value;
    sqlite3VdbeAddOp4Dup8(v, OP_Real, 0, iMem, 0, (u8*)&value, P4_REAL);
  }
}